

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t * __thiscall
andres::
BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
::shapeBegin(BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
             *this)

{
  size_t *psVar1;
  BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *this_local;
  
  psVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shapeBegin(this->e_);
  return psVar1;
}

Assistant:

const std::size_t* shapeBegin() const 
        { return e_.shapeBegin(); }